

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

bool __thiscall flow::lang::Parser::importDecl(Parser *this,UnitSym *unit)

{
  bool bVar1;
  Token TVar2;
  ulong uVar3;
  char *pcVar4;
  pointer this_00;
  SourceLocation *pSVar5;
  reference ppNVar6;
  NativeCallback *native;
  iterator __end3;
  iterator __begin3;
  vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *__range3;
  vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> builtins;
  string *name;
  iterator __end2;
  iterator __begin2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_d0 [32];
  long local_b0;
  size_t r;
  string base;
  undefined1 local_68 [8];
  string path;
  undefined1 local_38 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  UnitSym *unit_local;
  Parser *this_local;
  
  names.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)unit;
  nextToken(this);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_38);
  bVar1 = importOne(this,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_38);
  if (bVar1) {
    do {
      TVar2 = token(this);
      if (TVar2 != Comma) {
        std::__cxx11::string::string((string *)local_68);
        bVar1 = consumeIf(this,From);
        if (bVar1) {
          stringValue_abi_cxx11_((string *)((long)&base.field_2 + 8),this);
          std::__cxx11::string::operator=
                    ((string *)local_68,(string *)(base.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
          bVar1 = consumeOne<flow::lang::Token,flow::lang::Token>(this,String,RawString);
          if (!bVar1) {
            consumeUntil(this,Semicolon);
            this_local._7_1_ = 0;
            path.field_2._8_4_ = 1;
            goto LAB_00154f31;
          }
          uVar3 = std::__cxx11::string::empty();
          if (((uVar3 & 1) == 0) &&
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 != '/')) {
            this_00 = std::unique_ptr<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>::
                      operator->(&this->lexer_);
            pSVar5 = Lexer::location(this_00);
            std::__cxx11::string::string((string *)&r,(string *)pSVar5);
            local_b0 = std::__cxx11::string::rfind((char)&r,0x2f);
            if (local_b0 != -1) {
              local_b0 = local_b0 + 1;
            }
            std::__cxx11::string::substr((ulong)local_d0,(ulong)&r);
            std::__cxx11::string::operator=((string *)&r,local_d0);
            std::__cxx11::string::~string(local_d0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__range2,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68);
            std::__cxx11::string::operator=((string *)local_68,(string *)&__range2);
            std::__cxx11::string::~string((string *)&__range2);
            std::__cxx11::string::~string((string *)&r);
          }
        }
        __end2 = std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_38);
        name = (string *)
               std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38);
        goto LAB_00154d92;
      }
      nextToken(this);
      bVar1 = importOne(this,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_38);
    } while (bVar1);
    consumeUntil(this,Semicolon);
    this_local._7_1_ = 0;
    path.field_2._8_4_ = 1;
  }
  else {
    consumeUntil(this,Semicolon);
    this_local._7_1_ = 0;
    path.field_2._8_4_ = 1;
  }
  goto LAB_00154f47;
LAB_00154d92:
  bVar1 = std::operator!=(&__end2,(_Self *)&name);
  if (!bVar1) goto LAB_00154f13;
  builtins.super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end2);
  std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::vector
            ((vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *)&__range3);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->importHandler_);
  if ((!bVar1) ||
     (bVar1 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_*)>
              ::operator()(&this->importHandler_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           builtins.
                           super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,(vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>
                                     *)&__range3), bVar1)) {
    UnitSym::import((UnitSym *)
                    names.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size,
                    (string *)
                    builtins.
                    super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_68);
    __end3 = std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::begin
                       ((vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *)
                        &__range3);
    native = (NativeCallback *)
             std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::end
                       ((vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *)
                        &__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<flow::NativeCallback_**,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_>
                                       *)&native), bVar1) {
      ppNVar6 = __gnu_cxx::
                __normal_iterator<flow::NativeCallback_**,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_>
                ::operator*(&__end3);
      declareBuiltin(this,*ppNVar6);
      __gnu_cxx::
      __normal_iterator<flow::NativeCallback_**,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_>
      ::operator++(&__end3);
    }
    path.field_2._8_4_ = 0;
  }
  else {
    this_local._7_1_ = 0;
    path.field_2._8_4_ = 1;
  }
  std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::~vector
            ((vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *)&__range3);
  if (path.field_2._8_4_ != 0) goto LAB_00154f31;
  std::
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++(&__end2);
  goto LAB_00154d92;
LAB_00154f13:
  consume(this,Semicolon);
  this_local._7_1_ = 1;
  path.field_2._8_4_ = 1;
LAB_00154f31:
  std::__cxx11::string::~string((string *)local_68);
LAB_00154f47:
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::importDecl(UnitSym* unit) {
  // 'import' NAME_OR_NAMELIST ['from' PATH] ';'
  nextToken();  // skip 'import'

  std::list<std::string> names;
  if (!importOne(names)) {
    consumeUntil(Token::Semicolon);
    return false;
  }

  while (token() == Token::Comma) {
    nextToken();
    if (!importOne(names)) {
      consumeUntil(Token::Semicolon);
      return false;
    }
  }

  std::string path;
  if (consumeIf(Token::From)) {
    path = stringValue();

    if (!consumeOne(Token::String, Token::RawString)) {
      consumeUntil(Token::Semicolon);
      return false;
    }

    if (!path.empty() && path[0] != '/') {
      std::string base(lexer_->location().filename);

      size_t r = base.rfind('/');
      if (r != std::string::npos) ++r;

      base = base.substr(0, r);
      path = base + path;
    }
  }

  for (const std::string& name: names) {
    std::vector<NativeCallback*> builtins;

    if (importHandler_ && !importHandler_(name, path, &builtins))
      return false;

    unit->import(name, path);

    for (NativeCallback* native : builtins) {
      declareBuiltin(native);
    }
  }

  consume(Token::Semicolon);
  return true;
}